

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this,string *line)

{
  pointer *__s;
  bool bVar1;
  const_iterator ppcVar2;
  const_iterator __last;
  char **ppcVar3;
  mexcept *pmVar4;
  allocator<char> local_2af1;
  string local_2af0;
  undefined1 local_2aca;
  allocator<char> local_2ac9;
  string local_2ac8;
  undefined1 local_2aa2;
  allocator<char> local_2aa1;
  string local_2aa0;
  undefined1 local_2a7a;
  allocator<char> local_2a79;
  string local_2a78;
  undefined1 local_2a52;
  allocator<char> local_2a51;
  string local_2a50;
  undefined1 local_2a2a;
  allocator<char> local_2a29;
  string local_2a28;
  undefined1 local_2a02;
  allocator<char> local_2a01;
  string local_2a00;
  undefined1 local_29da;
  allocator<char> local_29d9;
  string local_29d8;
  undefined1 local_29b2;
  allocator<char> local_29b1;
  string local_29b0;
  undefined1 local_298a;
  allocator<char> local_2989;
  string local_2988;
  undefined1 local_2962;
  allocator<char> local_2961;
  string local_2960;
  undefined1 local_293a;
  allocator<char> local_2939;
  string local_2938;
  undefined1 local_2912;
  allocator<char> local_2911;
  string local_2910;
  undefined1 local_28ea;
  allocator<char> local_28e9;
  string local_28e8;
  undefined1 local_28c2;
  allocator<char> local_28c1;
  string local_28c0;
  undefined1 local_289a;
  allocator<char> local_2899;
  string local_2898;
  undefined1 local_2872;
  allocator<char> local_2871;
  string local_2870;
  undefined1 local_284a;
  allocator<char> local_2849;
  string local_2848;
  undefined1 local_2822;
  allocator<char> local_2821;
  string local_2820;
  undefined1 local_27fa;
  allocator<char> local_27f9;
  string local_27f8;
  undefined1 local_27d2;
  allocator<char> local_27d1;
  string local_27d0;
  undefined1 local_27aa;
  allocator<char> local_27a9;
  string local_27a8;
  undefined1 local_2782;
  allocator<char> local_2781;
  string local_2780;
  undefined1 local_275a;
  allocator<char> local_2759;
  string local_2758;
  undefined1 local_2732;
  allocator<char> local_2731;
  string local_2730;
  undefined1 local_270a;
  allocator<char> local_2709;
  string local_2708;
  undefined1 local_26e2;
  allocator<char> local_26e1;
  string local_26e0;
  undefined1 local_26ba;
  allocator<char> local_26b9;
  string local_26b8;
  undefined1 local_2692;
  allocator<char> local_2691;
  string local_2690;
  undefined1 local_266a;
  allocator<char> local_2669;
  string local_2668;
  undefined1 local_2642;
  allocator<char> local_2641;
  string local_2640;
  undefined1 local_261a;
  allocator<char> local_2619;
  string local_2618;
  undefined1 local_25f2;
  allocator<char> local_25f1;
  string local_25f0;
  undefined1 local_25ca;
  allocator<char> local_25c9;
  string local_25c8;
  undefined1 local_25a2;
  allocator<char> local_25a1;
  string local_25a0;
  undefined1 local_257a;
  allocator<char> local_2579;
  string local_2578;
  undefined1 local_2552;
  allocator<char> local_2551;
  string local_2550;
  undefined1 local_252a;
  allocator<char> local_2529;
  string local_2528;
  undefined1 local_2502;
  allocator<char> local_2501;
  string local_2500;
  undefined1 local_24da;
  allocator<char> local_24d9;
  string local_24d8;
  undefined1 local_24b2;
  allocator<char> local_24b1;
  string local_24b0;
  undefined1 local_248a;
  allocator<char> local_2489;
  string local_2488;
  undefined1 local_2462;
  allocator<char> local_2461;
  string local_2460;
  undefined1 local_243a;
  allocator<char> local_2439;
  string local_2438;
  undefined1 local_2412;
  allocator<char> local_2411;
  string local_2410;
  undefined1 local_23ea;
  allocator<char> local_23e9;
  string local_23e8;
  undefined1 local_23c2;
  allocator<char> local_23c1;
  string local_23c0;
  undefined1 local_239a;
  allocator<char> local_2399;
  string local_2398;
  undefined1 local_2372;
  allocator<char> local_2371;
  string local_2370;
  undefined1 local_234a;
  allocator<char> local_2349;
  string local_2348;
  undefined1 local_2322;
  allocator<char> local_2321;
  string local_2320;
  undefined1 local_22fa;
  allocator<char> local_22f9;
  string local_22f8;
  undefined1 local_22d2;
  allocator<char> local_22d1;
  string local_22d0;
  undefined1 local_22aa;
  allocator<char> local_22a9;
  string local_22a8;
  undefined1 local_2282;
  allocator<char> local_2281;
  string local_2280;
  undefined1 local_225a;
  allocator<char> local_2259;
  string local_2258;
  undefined1 local_2232;
  allocator<char> local_2231;
  string local_2230;
  undefined1 local_220a;
  allocator<char> local_2209;
  string local_2208;
  undefined1 local_21e2;
  allocator<char> local_21e1;
  string local_21e0;
  undefined1 local_21ba;
  allocator<char> local_21b9;
  string local_21b8;
  undefined1 local_2192;
  allocator<char> local_2191;
  string local_2190;
  undefined1 local_216a;
  allocator<char> local_2169;
  string local_2168;
  undefined1 local_2142;
  allocator<char> local_2141;
  string local_2140;
  undefined1 local_211a;
  allocator<char> local_2119;
  string local_2118;
  undefined1 local_20f2;
  allocator<char> local_20f1;
  string local_20f0;
  undefined1 local_20ca;
  allocator<char> local_20c9;
  string local_20c8;
  undefined1 local_20a2;
  allocator<char> local_20a1;
  string local_20a0;
  undefined1 local_207a;
  allocator<char> local_2079;
  string local_2078;
  undefined1 local_2052;
  allocator<char> local_2051;
  string local_2050;
  undefined1 local_202a;
  allocator<char> local_2029;
  string local_2028;
  undefined1 local_2002;
  allocator<char> local_2001;
  string local_2000;
  undefined1 local_1fda;
  allocator<char> local_1fd9;
  string local_1fd8;
  undefined1 local_1fb2;
  allocator<char> local_1fb1;
  string local_1fb0;
  undefined1 local_1f8a;
  allocator<char> local_1f89;
  string local_1f88;
  undefined1 local_1f62;
  allocator<char> local_1f61;
  string local_1f60;
  undefined1 local_1f3a;
  allocator<char> local_1f39;
  string local_1f38;
  undefined1 local_1f12;
  allocator<char> local_1f11;
  string local_1f10;
  undefined1 local_1eea;
  allocator<char> local_1ee9;
  string local_1ee8;
  undefined1 local_1ec2;
  allocator<char> local_1ec1;
  string local_1ec0;
  undefined1 local_1e9a;
  allocator<char> local_1e99;
  string local_1e98;
  undefined1 local_1e72;
  allocator<char> local_1e71;
  string local_1e70;
  undefined1 local_1e4a;
  allocator<char> local_1e49;
  string local_1e48;
  undefined1 local_1e22;
  allocator<char> local_1e21;
  string local_1e20;
  undefined1 local_1dfa;
  allocator<char> local_1df9;
  string local_1df8;
  undefined1 local_1dd2;
  allocator<char> local_1dd1;
  string local_1dd0;
  undefined1 local_1daa;
  allocator<char> local_1da9;
  string local_1da8;
  undefined1 local_1d82;
  allocator<char> local_1d81;
  string local_1d80;
  undefined1 local_1d5a;
  allocator<char> local_1d59;
  string local_1d58;
  undefined1 local_1d32;
  allocator<char> local_1d31;
  string local_1d30;
  undefined1 local_1d0a;
  allocator<char> local_1d09;
  string local_1d08;
  undefined1 local_1ce2;
  allocator<char> local_1ce1;
  string local_1ce0;
  undefined1 local_1cba;
  allocator<char> local_1cb9;
  string local_1cb8;
  undefined1 local_1c92;
  allocator<char> local_1c91;
  string local_1c90;
  undefined1 local_1c6a;
  allocator<char> local_1c69;
  string local_1c68;
  undefined1 local_1c42;
  allocator<char> local_1c41;
  string local_1c40;
  undefined1 local_1c1a;
  allocator<char> local_1c19;
  string local_1c18;
  undefined1 local_1bf2;
  allocator<char> local_1bf1;
  string local_1bf0;
  undefined1 local_1bca;
  allocator<char> local_1bc9;
  string local_1bc8;
  undefined1 local_1ba2;
  allocator<char> local_1ba1;
  string local_1ba0;
  undefined1 local_1b7a;
  allocator<char> local_1b79;
  string local_1b78;
  undefined1 local_1b52;
  allocator<char> local_1b51;
  string local_1b50;
  undefined1 local_1b2a;
  allocator<char> local_1b29;
  string local_1b28;
  undefined1 local_1b02;
  allocator<char> local_1b01;
  string local_1b00;
  undefined1 local_1ada;
  allocator<char> local_1ad9;
  string local_1ad8;
  undefined1 local_1ab2;
  allocator<char> local_1ab1;
  string local_1ab0;
  undefined1 local_1a8a;
  allocator<char> local_1a89;
  string local_1a88;
  undefined1 local_1a62;
  allocator<char> local_1a61;
  string local_1a60;
  undefined1 local_1a3a;
  allocator<char> local_1a39;
  string local_1a38;
  undefined1 local_1a12;
  allocator<char> local_1a11;
  string local_1a10;
  undefined1 local_19ea;
  allocator<char> local_19e9;
  string local_19e8;
  undefined1 local_19c2;
  allocator<char> local_19c1;
  string local_19c0;
  undefined1 local_199a;
  allocator<char> local_1999;
  string local_1998;
  undefined1 local_1972;
  allocator<char> local_1971;
  string local_1970;
  undefined1 local_194a;
  allocator<char> local_1949;
  string local_1948;
  undefined1 local_1922;
  allocator<char> local_1921;
  string local_1920;
  undefined1 local_18fa;
  allocator<char> local_18f9;
  string local_18f8;
  undefined1 local_18d2;
  allocator<char> local_18d1;
  string local_18d0;
  undefined1 local_18aa;
  allocator<char> local_18a9;
  string local_18a8;
  undefined1 local_1882;
  allocator<char> local_1881;
  string local_1880;
  undefined1 local_185a;
  allocator<char> local_1859;
  string local_1858;
  undefined1 local_1832;
  allocator<char> local_1831;
  string local_1830;
  undefined1 local_180a;
  allocator<char> local_1809;
  string local_1808;
  undefined1 local_17e2;
  allocator<char> local_17e1;
  string local_17e0;
  undefined1 local_17ba;
  allocator<char> local_17b9;
  string local_17b8;
  undefined1 local_1792;
  allocator<char> local_1791;
  string local_1790;
  undefined1 local_176a;
  allocator<char> local_1769;
  string local_1768;
  undefined1 local_1742;
  allocator<char> local_1741;
  string local_1740;
  undefined1 local_171a;
  allocator<char> local_1719;
  string local_1718;
  undefined1 local_16f2;
  allocator<char> local_16f1;
  string local_16f0;
  undefined1 local_16ca;
  allocator<char> local_16c9;
  string local_16c8;
  undefined1 local_16a2;
  allocator<char> local_16a1;
  string local_16a0;
  undefined1 local_167a;
  allocator<char> local_1679;
  string local_1678;
  undefined1 local_1652;
  allocator<char> local_1651;
  string local_1650;
  undefined1 local_162a;
  allocator<char> local_1629;
  string local_1628;
  undefined1 local_1602;
  allocator<char> local_1601;
  string local_1600;
  undefined1 local_15da;
  allocator<char> local_15d9;
  string local_15d8;
  undefined1 local_15b2;
  allocator<char> local_15b1;
  string local_15b0;
  undefined1 local_158a;
  allocator<char> local_1589;
  string local_1588;
  undefined1 local_1562;
  allocator<char> local_1561;
  string local_1560;
  undefined1 local_153a;
  allocator<char> local_1539;
  string local_1538;
  undefined1 local_1512;
  allocator<char> local_1511;
  string local_1510;
  undefined1 local_14ea;
  allocator<char> local_14e9;
  string local_14e8;
  undefined1 local_14c2;
  allocator<char> local_14c1;
  string local_14c0;
  undefined1 local_149a;
  allocator<char> local_1499;
  string local_1498;
  undefined1 local_1472;
  allocator<char> local_1471;
  string local_1470;
  undefined1 local_144a;
  allocator<char> local_1449;
  string local_1448;
  undefined1 local_1422;
  allocator<char> local_1421;
  string local_1420;
  undefined1 local_13fa;
  allocator<char> local_13f9;
  string local_13f8;
  undefined1 local_13d2;
  allocator<char> local_13d1;
  string local_13d0;
  undefined1 local_13aa;
  allocator<char> local_13a9;
  string local_13a8;
  undefined1 local_1382;
  allocator<char> local_1381;
  string local_1380;
  undefined1 local_135a;
  allocator<char> local_1359;
  string local_1358;
  undefined1 local_1332;
  allocator<char> local_1331;
  string local_1330;
  undefined1 local_130a;
  allocator<char> local_1309;
  string local_1308;
  undefined1 local_12e2;
  allocator<char> local_12e1;
  string local_12e0;
  undefined1 local_12ba;
  allocator<char> local_12b9;
  string local_12b8;
  undefined1 local_1292;
  allocator<char> local_1291;
  string local_1290;
  undefined1 local_126a;
  allocator<char> local_1269;
  string local_1268;
  undefined1 local_1242;
  allocator<char> local_1241;
  string local_1240;
  undefined1 local_121a;
  allocator<char> local_1219;
  string local_1218;
  undefined1 local_11f2;
  allocator<char> local_11f1;
  string local_11f0;
  undefined1 local_11ca;
  allocator<char> local_11c9;
  string local_11c8;
  undefined1 local_11a2;
  allocator<char> local_11a1;
  string local_11a0;
  undefined1 local_117a;
  allocator<char> local_1179;
  string local_1178;
  undefined1 local_1152;
  allocator<char> local_1151;
  string local_1150;
  undefined1 local_112a;
  allocator<char> local_1129;
  string local_1128;
  undefined1 local_1102;
  allocator<char> local_1101;
  string local_1100;
  undefined1 local_10da;
  allocator<char> local_10d9;
  string local_10d8;
  undefined1 local_10b2;
  allocator<char> local_10b1;
  string local_10b0;
  undefined1 local_108a;
  allocator<char> local_1089;
  string local_1088;
  undefined1 local_1062;
  allocator<char> local_1061;
  string local_1060;
  undefined1 local_103a;
  allocator<char> local_1039;
  string local_1038;
  undefined1 local_1012;
  allocator<char> local_1011;
  string local_1010;
  undefined1 local_fea;
  allocator<char> local_fe9;
  string local_fe8;
  undefined1 local_fc2;
  allocator<char> local_fc1;
  string local_fc0;
  undefined1 local_f9a;
  allocator<char> local_f99;
  string local_f98;
  undefined1 local_f72;
  allocator<char> local_f71;
  string local_f70;
  undefined1 local_f4a;
  allocator<char> local_f49;
  string local_f48;
  undefined1 local_f22;
  allocator<char> local_f21;
  string local_f20;
  undefined1 local_efa;
  allocator<char> local_ef9;
  string local_ef8;
  undefined1 local_ed2;
  allocator<char> local_ed1;
  string local_ed0;
  undefined1 local_eaa;
  allocator<char> local_ea9;
  string local_ea8;
  undefined1 local_e82;
  allocator<char> local_e81;
  string local_e80;
  undefined1 local_e5a;
  allocator<char> local_e59;
  string local_e58;
  undefined1 local_e32;
  allocator<char> local_e31;
  string local_e30;
  undefined1 local_e0a;
  allocator<char> local_e09;
  string local_e08;
  undefined1 local_de2;
  allocator<char> local_de1;
  string local_de0;
  undefined1 local_dba;
  allocator<char> local_db9;
  string local_db8;
  undefined1 local_d92;
  allocator<char> local_d91;
  string local_d90;
  undefined1 local_d6a;
  allocator<char> local_d69;
  string local_d68;
  undefined1 local_d42;
  allocator<char> local_d41;
  string local_d40;
  undefined1 local_d1a;
  allocator<char> local_d19;
  string local_d18;
  undefined1 local_cf2;
  allocator<char> local_cf1;
  string local_cf0;
  undefined1 local_cca;
  allocator<char> local_cc9;
  string local_cc8;
  undefined1 local_ca2;
  allocator<char> local_ca1;
  string local_ca0;
  undefined1 local_c7a;
  allocator<char> local_c79;
  string local_c78;
  undefined1 local_c52;
  allocator<char> local_c51;
  string local_c50;
  undefined1 local_c2a;
  allocator<char> local_c29;
  string local_c28;
  undefined1 local_c02;
  allocator<char> local_c01;
  string local_c00;
  undefined1 local_bda;
  allocator<char> local_bd9;
  string local_bd8;
  undefined1 local_bb2;
  allocator<char> local_bb1;
  string local_bb0;
  undefined1 local_b8a;
  allocator<char> local_b89;
  string local_b88;
  undefined1 local_b62;
  allocator<char> local_b61;
  string local_b60;
  undefined1 local_b3a;
  allocator<char> local_b39;
  string local_b38;
  undefined1 local_b12;
  allocator<char> local_b11;
  string local_b10;
  undefined1 local_aea;
  allocator<char> local_ae9;
  string local_ae8;
  undefined1 local_ac2;
  allocator<char> local_ac1;
  string local_ac0;
  undefined1 local_a9a;
  allocator<char> local_a99;
  string local_a98;
  undefined1 local_a72;
  allocator<char> local_a71;
  string local_a70;
  undefined1 local_a4a;
  allocator<char> local_a49;
  string local_a48;
  undefined1 local_a22;
  allocator<char> local_a21;
  string local_a20;
  undefined1 local_9fa;
  allocator<char> local_9f9;
  string local_9f8;
  undefined1 local_9d2;
  allocator<char> local_9d1;
  string local_9d0;
  undefined1 local_9aa;
  allocator<char> local_9a9;
  string local_9a8;
  undefined1 local_982;
  allocator<char> local_981;
  string local_980;
  undefined1 local_95a;
  allocator<char> local_959;
  string local_958;
  undefined1 local_932;
  allocator<char> local_931;
  string local_930;
  undefined1 local_90a;
  allocator<char> local_909;
  string local_908;
  undefined1 local_8e2;
  allocator<char> local_8e1;
  string local_8e0;
  undefined1 local_8ba;
  allocator<char> local_8b9;
  string local_8b8;
  undefined1 local_892;
  allocator<char> local_891;
  string local_890;
  undefined1 local_86a;
  allocator<char> local_869;
  string local_868;
  undefined1 local_842;
  allocator<char> local_841;
  string local_840;
  undefined1 local_81a;
  allocator<char> local_819;
  string local_818;
  undefined1 local_7f2;
  allocator<char> local_7f1;
  string local_7f0;
  undefined1 local_7ca;
  allocator<char> local_7c9;
  string local_7c8;
  undefined1 local_7a2;
  allocator<char> local_7a1;
  string local_7a0;
  undefined1 local_77a;
  allocator<char> local_779;
  string local_778;
  undefined1 local_752;
  allocator<char> local_751;
  string local_750;
  undefined1 local_72a;
  allocator<char> local_729;
  string local_728;
  undefined1 local_702;
  allocator<char> local_701;
  string local_700;
  undefined1 local_6da;
  allocator<char> local_6d9;
  string local_6d8;
  undefined1 local_6b2;
  allocator<char> local_6b1;
  string local_6b0;
  undefined1 local_68a;
  allocator<char> local_689;
  string local_688;
  undefined1 local_662;
  allocator<char> local_661;
  string local_660;
  undefined1 local_63a;
  allocator<char> local_639;
  string local_638;
  undefined1 local_612;
  allocator<char> local_611;
  string local_610;
  undefined1 local_5ea;
  allocator<char> local_5e9;
  string local_5e8;
  undefined1 local_5c2;
  allocator<char> local_5c1;
  string local_5c0;
  undefined1 local_59a;
  allocator<char> local_599;
  string local_598;
  undefined1 local_572;
  allocator<char> local_571;
  string local_570;
  undefined1 local_54a;
  allocator<char> local_549;
  string local_548;
  undefined1 local_522;
  allocator<char> local_521;
  string local_520;
  undefined1 local_4fa;
  allocator<char> local_4f9;
  string local_4f8;
  undefined1 local_4d2;
  allocator<char> local_4d1;
  string local_4d0;
  undefined1 local_4aa;
  allocator<char> local_4a9;
  string local_4a8;
  undefined1 local_482;
  allocator<char> local_481;
  string local_480;
  undefined1 local_45a;
  allocator<char> local_459;
  string local_458;
  undefined1 local_432;
  allocator<char> local_431;
  string local_430;
  undefined1 local_40a;
  allocator<char> local_409;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  const_iterator local_3d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  const_iterator local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  const_iterator local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  const_iterator local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  const_iterator local_318;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  const_iterator local_2e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  const_iterator local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  difference_type local_298;
  difference_type instr_index;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_268;
  char **local_260;
  char **iname_it;
  string local_250;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_229;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_228;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1e8;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istringstream iss;
  string *line_local;
  assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytecode;
  
  __s = &tokens.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::istringstream::istringstream((istringstream *)__s,line,8);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1e8,(istream_type *)__s);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_228);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_229);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1b8,
             &local_1e8,&local_228,&local_229);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_229);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_228);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_1e8);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
  if (bVar1) {
    iname_it._6_1_ = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"[-][mvm] no instruction token",
               (allocator<char> *)((long)&iname_it + 7));
    mexcept::mexcept(pmVar4,&local_250,NO_INSTR_NAME);
    iname_it._6_1_ = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  ppcVar2 = std::cbegin<std::array<char_const*const,7ul>>
                      (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names);
  __last = std::cend<std::array<char_const*const,7ul>>
                     (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names);
  local_268 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8;
  ppcVar3 = std::
            find_if<char_const*const*,mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                      (ppcVar2,__last,(anon_class_8_1_6d6476d8_for__M_pred)local_268);
  local_260 = ppcVar3;
  ppcVar2 = std::cend<std::array<char_const*const,7ul>>
                      (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names);
  if (ppcVar3 == ppcVar2) {
    instr_index._6_1_ = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"[-][mvm] invalid instruction name",
               (allocator<char> *)((long)&instr_index + 7));
    mexcept::mexcept(pmVar4,&local_288,BAD_INSTR_NAME);
    instr_index._6_1_ = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  instr_index._5_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  ppcVar2 = std::cbegin<std::array<char_const*const,7ul>>
                      (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names);
  local_298 = std::distance<char_const*const*>(ppcVar2,local_260);
  switch(local_298) {
  case 0:
    local_2c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2b8,&local_2c0);
    local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_2b8);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::zero,mvm::typestring::type_string<(char)122,(char)101,(char)114,(char)111,(char)0>>>
              (&local_2b0,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,'\0'
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_2b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2b0);
    break;
  case 1:
    local_2f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2e8,&local_2f0);
    local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_2e8);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,true,&mvm::test::test_instr_set::jump,mvm::typestring::type_string<(char)106,(char)117,(char)109,(char)112,(char)0>>>
              (&local_2e0,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x01',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_2e0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2e0);
    break;
  case 2:
    local_320._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_318,&local_320);
    local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_318);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,false,&mvm::test::test_instr_set::dup,mvm::typestring::type_string<(char)100,(char)117,(char)112,(char)0>>>
              (&local_310,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x02',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_310);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_310);
    break;
  case 3:
    local_350._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_348,&local_350);
    local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_348);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
              (&local_340,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x03',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_340);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_340);
    break;
  case 4:
    local_380._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_378,&local_380);
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_378);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::randn,mvm::typestring::type_string<(char)114,(char)97,(char)110,(char)100,(char)110,(char)0>>>
              (&local_370,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x04',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_370);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_370);
    break;
  case 5:
    local_3b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3a8,&local_3b0);
    local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_3a8);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::iterable_consumer<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,mvm::count_from<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>>>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::rotln,mvm::typestring::type_string<(char)114,(char)111,(char)116,(char)108,(char)110,(char)0>>>
              (&local_3a0,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x05',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_3a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3a0);
    break;
  case 6:
    local_3e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3d8,&local_3e0);
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,local_3d8);
    assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
    assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::add,mvm::typestring::type_string<(char)97,(char)100,(char)100,(char)0>>>
              (&local_3d0,(assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *)this,
               '\x06',(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_3d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3d0);
    break;
  case 7:
    local_40a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"[-][mvm] invalid instruction opcode",&local_409);
    mexcept::mexcept(pmVar4,&local_408,INVALID_INSTR_OPCODE);
    local_40a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 8:
    local_432 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"[-][mvm] invalid instruction opcode",&local_431);
    mexcept::mexcept(pmVar4,&local_430,INVALID_INSTR_OPCODE);
    local_432 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 9:
    local_45a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"[-][mvm] invalid instruction opcode",&local_459);
    mexcept::mexcept(pmVar4,&local_458,INVALID_INSTR_OPCODE);
    local_45a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 10:
    local_482 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"[-][mvm] invalid instruction opcode",&local_481);
    mexcept::mexcept(pmVar4,&local_480,INVALID_INSTR_OPCODE);
    local_482 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb:
    local_4aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"[-][mvm] invalid instruction opcode",&local_4a9);
    mexcept::mexcept(pmVar4,&local_4a8,INVALID_INSTR_OPCODE);
    local_4aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc:
    local_4d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"[-][mvm] invalid instruction opcode",&local_4d1);
    mexcept::mexcept(pmVar4,&local_4d0,INVALID_INSTR_OPCODE);
    local_4d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd:
    local_4fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,"[-][mvm] invalid instruction opcode",&local_4f9);
    mexcept::mexcept(pmVar4,&local_4f8,INVALID_INSTR_OPCODE);
    local_4fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe:
    local_522 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"[-][mvm] invalid instruction opcode",&local_521);
    mexcept::mexcept(pmVar4,&local_520,INVALID_INSTR_OPCODE);
    local_522 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf:
    local_54a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,"[-][mvm] invalid instruction opcode",&local_549);
    mexcept::mexcept(pmVar4,&local_548,INVALID_INSTR_OPCODE);
    local_54a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x10:
    local_572 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"[-][mvm] invalid instruction opcode",&local_571);
    mexcept::mexcept(pmVar4,&local_570,INVALID_INSTR_OPCODE);
    local_572 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x11:
    local_59a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"[-][mvm] invalid instruction opcode",&local_599);
    mexcept::mexcept(pmVar4,&local_598,INVALID_INSTR_OPCODE);
    local_59a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x12:
    local_5c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,"[-][mvm] invalid instruction opcode",&local_5c1);
    mexcept::mexcept(pmVar4,&local_5c0,INVALID_INSTR_OPCODE);
    local_5c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x13:
    local_5ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"[-][mvm] invalid instruction opcode",&local_5e9);
    mexcept::mexcept(pmVar4,&local_5e8,INVALID_INSTR_OPCODE);
    local_5ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x14:
    local_612 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_610,"[-][mvm] invalid instruction opcode",&local_611);
    mexcept::mexcept(pmVar4,&local_610,INVALID_INSTR_OPCODE);
    local_612 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x15:
    local_63a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_638,"[-][mvm] invalid instruction opcode",&local_639);
    mexcept::mexcept(pmVar4,&local_638,INVALID_INSTR_OPCODE);
    local_63a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x16:
    local_662 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,"[-][mvm] invalid instruction opcode",&local_661);
    mexcept::mexcept(pmVar4,&local_660,INVALID_INSTR_OPCODE);
    local_662 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x17:
    local_68a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,"[-][mvm] invalid instruction opcode",&local_689);
    mexcept::mexcept(pmVar4,&local_688,INVALID_INSTR_OPCODE);
    local_68a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x18:
    local_6b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b0,"[-][mvm] invalid instruction opcode",&local_6b1);
    mexcept::mexcept(pmVar4,&local_6b0,INVALID_INSTR_OPCODE);
    local_6b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x19:
    local_6da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"[-][mvm] invalid instruction opcode",&local_6d9);
    mexcept::mexcept(pmVar4,&local_6d8,INVALID_INSTR_OPCODE);
    local_6da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1a:
    local_702 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"[-][mvm] invalid instruction opcode",&local_701);
    mexcept::mexcept(pmVar4,&local_700,INVALID_INSTR_OPCODE);
    local_702 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1b:
    local_72a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"[-][mvm] invalid instruction opcode",&local_729);
    mexcept::mexcept(pmVar4,&local_728,INVALID_INSTR_OPCODE);
    local_72a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1c:
    local_752 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_750,"[-][mvm] invalid instruction opcode",&local_751);
    mexcept::mexcept(pmVar4,&local_750,INVALID_INSTR_OPCODE);
    local_752 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1d:
    local_77a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_778,"[-][mvm] invalid instruction opcode",&local_779);
    mexcept::mexcept(pmVar4,&local_778,INVALID_INSTR_OPCODE);
    local_77a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1e:
    local_7a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a0,"[-][mvm] invalid instruction opcode",&local_7a1);
    mexcept::mexcept(pmVar4,&local_7a0,INVALID_INSTR_OPCODE);
    local_7a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x1f:
    local_7ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,"[-][mvm] invalid instruction opcode",&local_7c9);
    mexcept::mexcept(pmVar4,&local_7c8,INVALID_INSTR_OPCODE);
    local_7ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x20:
    local_7f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"[-][mvm] invalid instruction opcode",&local_7f1);
    mexcept::mexcept(pmVar4,&local_7f0,INVALID_INSTR_OPCODE);
    local_7f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x21:
    local_81a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_818,"[-][mvm] invalid instruction opcode",&local_819);
    mexcept::mexcept(pmVar4,&local_818,INVALID_INSTR_OPCODE);
    local_81a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x22:
    local_842 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_840,"[-][mvm] invalid instruction opcode",&local_841);
    mexcept::mexcept(pmVar4,&local_840,INVALID_INSTR_OPCODE);
    local_842 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x23:
    local_86a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_868,"[-][mvm] invalid instruction opcode",&local_869);
    mexcept::mexcept(pmVar4,&local_868,INVALID_INSTR_OPCODE);
    local_86a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x24:
    local_892 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_890,"[-][mvm] invalid instruction opcode",&local_891);
    mexcept::mexcept(pmVar4,&local_890,INVALID_INSTR_OPCODE);
    local_892 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x25:
    local_8ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"[-][mvm] invalid instruction opcode",&local_8b9);
    mexcept::mexcept(pmVar4,&local_8b8,INVALID_INSTR_OPCODE);
    local_8ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x26:
    local_8e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e0,"[-][mvm] invalid instruction opcode",&local_8e1);
    mexcept::mexcept(pmVar4,&local_8e0,INVALID_INSTR_OPCODE);
    local_8e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x27:
    local_90a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_908,"[-][mvm] invalid instruction opcode",&local_909);
    mexcept::mexcept(pmVar4,&local_908,INVALID_INSTR_OPCODE);
    local_90a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x28:
    local_932 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"[-][mvm] invalid instruction opcode",&local_931);
    mexcept::mexcept(pmVar4,&local_930,INVALID_INSTR_OPCODE);
    local_932 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x29:
    local_95a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_958,"[-][mvm] invalid instruction opcode",&local_959);
    mexcept::mexcept(pmVar4,&local_958,INVALID_INSTR_OPCODE);
    local_95a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2a:
    local_982 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"[-][mvm] invalid instruction opcode",&local_981);
    mexcept::mexcept(pmVar4,&local_980,INVALID_INSTR_OPCODE);
    local_982 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2b:
    local_9aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a8,"[-][mvm] invalid instruction opcode",&local_9a9);
    mexcept::mexcept(pmVar4,&local_9a8,INVALID_INSTR_OPCODE);
    local_9aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2c:
    local_9d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d0,"[-][mvm] invalid instruction opcode",&local_9d1);
    mexcept::mexcept(pmVar4,&local_9d0,INVALID_INSTR_OPCODE);
    local_9d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2d:
    local_9fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f8,"[-][mvm] invalid instruction opcode",&local_9f9);
    mexcept::mexcept(pmVar4,&local_9f8,INVALID_INSTR_OPCODE);
    local_9fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2e:
    local_a22 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"[-][mvm] invalid instruction opcode",&local_a21);
    mexcept::mexcept(pmVar4,&local_a20,INVALID_INSTR_OPCODE);
    local_a22 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x2f:
    local_a4a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a48,"[-][mvm] invalid instruction opcode",&local_a49);
    mexcept::mexcept(pmVar4,&local_a48,INVALID_INSTR_OPCODE);
    local_a4a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x30:
    local_a72 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"[-][mvm] invalid instruction opcode",&local_a71);
    mexcept::mexcept(pmVar4,&local_a70,INVALID_INSTR_OPCODE);
    local_a72 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x31:
    local_a9a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a98,"[-][mvm] invalid instruction opcode",&local_a99);
    mexcept::mexcept(pmVar4,&local_a98,INVALID_INSTR_OPCODE);
    local_a9a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x32:
    local_ac2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"[-][mvm] invalid instruction opcode",&local_ac1);
    mexcept::mexcept(pmVar4,&local_ac0,INVALID_INSTR_OPCODE);
    local_ac2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x33:
    local_aea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae8,"[-][mvm] invalid instruction opcode",&local_ae9);
    mexcept::mexcept(pmVar4,&local_ae8,INVALID_INSTR_OPCODE);
    local_aea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x34:
    local_b12 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b10,"[-][mvm] invalid instruction opcode",&local_b11);
    mexcept::mexcept(pmVar4,&local_b10,INVALID_INSTR_OPCODE);
    local_b12 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x35:
    local_b3a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b38,"[-][mvm] invalid instruction opcode",&local_b39);
    mexcept::mexcept(pmVar4,&local_b38,INVALID_INSTR_OPCODE);
    local_b3a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x36:
    local_b62 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b60,"[-][mvm] invalid instruction opcode",&local_b61);
    mexcept::mexcept(pmVar4,&local_b60,INVALID_INSTR_OPCODE);
    local_b62 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x37:
    local_b8a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b88,"[-][mvm] invalid instruction opcode",&local_b89);
    mexcept::mexcept(pmVar4,&local_b88,INVALID_INSTR_OPCODE);
    local_b8a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x38:
    local_bb2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"[-][mvm] invalid instruction opcode",&local_bb1);
    mexcept::mexcept(pmVar4,&local_bb0,INVALID_INSTR_OPCODE);
    local_bb2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x39:
    local_bda = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd8,"[-][mvm] invalid instruction opcode",&local_bd9);
    mexcept::mexcept(pmVar4,&local_bd8,INVALID_INSTR_OPCODE);
    local_bda = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3a:
    local_c02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c00,"[-][mvm] invalid instruction opcode",&local_c01);
    mexcept::mexcept(pmVar4,&local_c00,INVALID_INSTR_OPCODE);
    local_c02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3b:
    local_c2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c28,"[-][mvm] invalid instruction opcode",&local_c29);
    mexcept::mexcept(pmVar4,&local_c28,INVALID_INSTR_OPCODE);
    local_c2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3c:
    local_c52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c50,"[-][mvm] invalid instruction opcode",&local_c51);
    mexcept::mexcept(pmVar4,&local_c50,INVALID_INSTR_OPCODE);
    local_c52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3d:
    local_c7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c78,"[-][mvm] invalid instruction opcode",&local_c79);
    mexcept::mexcept(pmVar4,&local_c78,INVALID_INSTR_OPCODE);
    local_c7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3e:
    local_ca2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca0,"[-][mvm] invalid instruction opcode",&local_ca1);
    mexcept::mexcept(pmVar4,&local_ca0,INVALID_INSTR_OPCODE);
    local_ca2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x3f:
    local_cca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc8,"[-][mvm] invalid instruction opcode",&local_cc9);
    mexcept::mexcept(pmVar4,&local_cc8,INVALID_INSTR_OPCODE);
    local_cca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x40:
    local_cf2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cf0,"[-][mvm] invalid instruction opcode",&local_cf1);
    mexcept::mexcept(pmVar4,&local_cf0,INVALID_INSTR_OPCODE);
    local_cf2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x41:
    local_d1a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d18,"[-][mvm] invalid instruction opcode",&local_d19);
    mexcept::mexcept(pmVar4,&local_d18,INVALID_INSTR_OPCODE);
    local_d1a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x42:
    local_d42 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d40,"[-][mvm] invalid instruction opcode",&local_d41);
    mexcept::mexcept(pmVar4,&local_d40,INVALID_INSTR_OPCODE);
    local_d42 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x43:
    local_d6a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d68,"[-][mvm] invalid instruction opcode",&local_d69);
    mexcept::mexcept(pmVar4,&local_d68,INVALID_INSTR_OPCODE);
    local_d6a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x44:
    local_d92 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d90,"[-][mvm] invalid instruction opcode",&local_d91);
    mexcept::mexcept(pmVar4,&local_d90,INVALID_INSTR_OPCODE);
    local_d92 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x45:
    local_dba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_db8,"[-][mvm] invalid instruction opcode",&local_db9);
    mexcept::mexcept(pmVar4,&local_db8,INVALID_INSTR_OPCODE);
    local_dba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x46:
    local_de2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_de0,"[-][mvm] invalid instruction opcode",&local_de1);
    mexcept::mexcept(pmVar4,&local_de0,INVALID_INSTR_OPCODE);
    local_de2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x47:
    local_e0a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e08,"[-][mvm] invalid instruction opcode",&local_e09);
    mexcept::mexcept(pmVar4,&local_e08,INVALID_INSTR_OPCODE);
    local_e0a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x48:
    local_e32 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e30,"[-][mvm] invalid instruction opcode",&local_e31);
    mexcept::mexcept(pmVar4,&local_e30,INVALID_INSTR_OPCODE);
    local_e32 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x49:
    local_e5a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e58,"[-][mvm] invalid instruction opcode",&local_e59);
    mexcept::mexcept(pmVar4,&local_e58,INVALID_INSTR_OPCODE);
    local_e5a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4a:
    local_e82 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e80,"[-][mvm] invalid instruction opcode",&local_e81);
    mexcept::mexcept(pmVar4,&local_e80,INVALID_INSTR_OPCODE);
    local_e82 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4b:
    local_eaa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ea8,"[-][mvm] invalid instruction opcode",&local_ea9);
    mexcept::mexcept(pmVar4,&local_ea8,INVALID_INSTR_OPCODE);
    local_eaa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4c:
    local_ed2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ed0,"[-][mvm] invalid instruction opcode",&local_ed1);
    mexcept::mexcept(pmVar4,&local_ed0,INVALID_INSTR_OPCODE);
    local_ed2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4d:
    local_efa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ef8,"[-][mvm] invalid instruction opcode",&local_ef9);
    mexcept::mexcept(pmVar4,&local_ef8,INVALID_INSTR_OPCODE);
    local_efa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4e:
    local_f22 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f20,"[-][mvm] invalid instruction opcode",&local_f21);
    mexcept::mexcept(pmVar4,&local_f20,INVALID_INSTR_OPCODE);
    local_f22 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x4f:
    local_f4a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f48,"[-][mvm] invalid instruction opcode",&local_f49);
    mexcept::mexcept(pmVar4,&local_f48,INVALID_INSTR_OPCODE);
    local_f4a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x50:
    local_f72 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f70,"[-][mvm] invalid instruction opcode",&local_f71);
    mexcept::mexcept(pmVar4,&local_f70,INVALID_INSTR_OPCODE);
    local_f72 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x51:
    local_f9a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f98,"[-][mvm] invalid instruction opcode",&local_f99);
    mexcept::mexcept(pmVar4,&local_f98,INVALID_INSTR_OPCODE);
    local_f9a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x52:
    local_fc2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fc0,"[-][mvm] invalid instruction opcode",&local_fc1);
    mexcept::mexcept(pmVar4,&local_fc0,INVALID_INSTR_OPCODE);
    local_fc2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x53:
    local_fea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fe8,"[-][mvm] invalid instruction opcode",&local_fe9);
    mexcept::mexcept(pmVar4,&local_fe8,INVALID_INSTR_OPCODE);
    local_fea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x54:
    local_1012 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1010,"[-][mvm] invalid instruction opcode",&local_1011);
    mexcept::mexcept(pmVar4,&local_1010,INVALID_INSTR_OPCODE);
    local_1012 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x55:
    local_103a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1038,"[-][mvm] invalid instruction opcode",&local_1039);
    mexcept::mexcept(pmVar4,&local_1038,INVALID_INSTR_OPCODE);
    local_103a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x56:
    local_1062 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1060,"[-][mvm] invalid instruction opcode",&local_1061);
    mexcept::mexcept(pmVar4,&local_1060,INVALID_INSTR_OPCODE);
    local_1062 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x57:
    local_108a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1088,"[-][mvm] invalid instruction opcode",&local_1089);
    mexcept::mexcept(pmVar4,&local_1088,INVALID_INSTR_OPCODE);
    local_108a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x58:
    local_10b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10b0,"[-][mvm] invalid instruction opcode",&local_10b1);
    mexcept::mexcept(pmVar4,&local_10b0,INVALID_INSTR_OPCODE);
    local_10b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x59:
    local_10da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10d8,"[-][mvm] invalid instruction opcode",&local_10d9);
    mexcept::mexcept(pmVar4,&local_10d8,INVALID_INSTR_OPCODE);
    local_10da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5a:
    local_1102 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1100,"[-][mvm] invalid instruction opcode",&local_1101);
    mexcept::mexcept(pmVar4,&local_1100,INVALID_INSTR_OPCODE);
    local_1102 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5b:
    local_112a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1128,"[-][mvm] invalid instruction opcode",&local_1129);
    mexcept::mexcept(pmVar4,&local_1128,INVALID_INSTR_OPCODE);
    local_112a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5c:
    local_1152 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1150,"[-][mvm] invalid instruction opcode",&local_1151);
    mexcept::mexcept(pmVar4,&local_1150,INVALID_INSTR_OPCODE);
    local_1152 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5d:
    local_117a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1178,"[-][mvm] invalid instruction opcode",&local_1179);
    mexcept::mexcept(pmVar4,&local_1178,INVALID_INSTR_OPCODE);
    local_117a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5e:
    local_11a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11a0,"[-][mvm] invalid instruction opcode",&local_11a1);
    mexcept::mexcept(pmVar4,&local_11a0,INVALID_INSTR_OPCODE);
    local_11a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x5f:
    local_11ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11c8,"[-][mvm] invalid instruction opcode",&local_11c9);
    mexcept::mexcept(pmVar4,&local_11c8,INVALID_INSTR_OPCODE);
    local_11ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x60:
    local_11f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11f0,"[-][mvm] invalid instruction opcode",&local_11f1);
    mexcept::mexcept(pmVar4,&local_11f0,INVALID_INSTR_OPCODE);
    local_11f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x61:
    local_121a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1218,"[-][mvm] invalid instruction opcode",&local_1219);
    mexcept::mexcept(pmVar4,&local_1218,INVALID_INSTR_OPCODE);
    local_121a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x62:
    local_1242 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1240,"[-][mvm] invalid instruction opcode",&local_1241);
    mexcept::mexcept(pmVar4,&local_1240,INVALID_INSTR_OPCODE);
    local_1242 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 99:
    local_126a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1268,"[-][mvm] invalid instruction opcode",&local_1269);
    mexcept::mexcept(pmVar4,&local_1268,INVALID_INSTR_OPCODE);
    local_126a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 100:
    local_1292 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1290,"[-][mvm] invalid instruction opcode",&local_1291);
    mexcept::mexcept(pmVar4,&local_1290,INVALID_INSTR_OPCODE);
    local_1292 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x65:
    local_12ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12b8,"[-][mvm] invalid instruction opcode",&local_12b9);
    mexcept::mexcept(pmVar4,&local_12b8,INVALID_INSTR_OPCODE);
    local_12ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x66:
    local_12e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12e0,"[-][mvm] invalid instruction opcode",&local_12e1);
    mexcept::mexcept(pmVar4,&local_12e0,INVALID_INSTR_OPCODE);
    local_12e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x67:
    local_130a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1308,"[-][mvm] invalid instruction opcode",&local_1309);
    mexcept::mexcept(pmVar4,&local_1308,INVALID_INSTR_OPCODE);
    local_130a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x68:
    local_1332 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1330,"[-][mvm] invalid instruction opcode",&local_1331);
    mexcept::mexcept(pmVar4,&local_1330,INVALID_INSTR_OPCODE);
    local_1332 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x69:
    local_135a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1358,"[-][mvm] invalid instruction opcode",&local_1359);
    mexcept::mexcept(pmVar4,&local_1358,INVALID_INSTR_OPCODE);
    local_135a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6a:
    local_1382 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1380,"[-][mvm] invalid instruction opcode",&local_1381);
    mexcept::mexcept(pmVar4,&local_1380,INVALID_INSTR_OPCODE);
    local_1382 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6b:
    local_13aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13a8,"[-][mvm] invalid instruction opcode",&local_13a9);
    mexcept::mexcept(pmVar4,&local_13a8,INVALID_INSTR_OPCODE);
    local_13aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6c:
    local_13d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13d0,"[-][mvm] invalid instruction opcode",&local_13d1);
    mexcept::mexcept(pmVar4,&local_13d0,INVALID_INSTR_OPCODE);
    local_13d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6d:
    local_13fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13f8,"[-][mvm] invalid instruction opcode",&local_13f9);
    mexcept::mexcept(pmVar4,&local_13f8,INVALID_INSTR_OPCODE);
    local_13fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6e:
    local_1422 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1420,"[-][mvm] invalid instruction opcode",&local_1421);
    mexcept::mexcept(pmVar4,&local_1420,INVALID_INSTR_OPCODE);
    local_1422 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x6f:
    local_144a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1448,"[-][mvm] invalid instruction opcode",&local_1449);
    mexcept::mexcept(pmVar4,&local_1448,INVALID_INSTR_OPCODE);
    local_144a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x70:
    local_1472 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1470,"[-][mvm] invalid instruction opcode",&local_1471);
    mexcept::mexcept(pmVar4,&local_1470,INVALID_INSTR_OPCODE);
    local_1472 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x71:
    local_149a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1498,"[-][mvm] invalid instruction opcode",&local_1499);
    mexcept::mexcept(pmVar4,&local_1498,INVALID_INSTR_OPCODE);
    local_149a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x72:
    local_14c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14c0,"[-][mvm] invalid instruction opcode",&local_14c1);
    mexcept::mexcept(pmVar4,&local_14c0,INVALID_INSTR_OPCODE);
    local_14c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x73:
    local_14ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14e8,"[-][mvm] invalid instruction opcode",&local_14e9);
    mexcept::mexcept(pmVar4,&local_14e8,INVALID_INSTR_OPCODE);
    local_14ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x74:
    local_1512 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1510,"[-][mvm] invalid instruction opcode",&local_1511);
    mexcept::mexcept(pmVar4,&local_1510,INVALID_INSTR_OPCODE);
    local_1512 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x75:
    local_153a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1538,"[-][mvm] invalid instruction opcode",&local_1539);
    mexcept::mexcept(pmVar4,&local_1538,INVALID_INSTR_OPCODE);
    local_153a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x76:
    local_1562 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1560,"[-][mvm] invalid instruction opcode",&local_1561);
    mexcept::mexcept(pmVar4,&local_1560,INVALID_INSTR_OPCODE);
    local_1562 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x77:
    local_158a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1588,"[-][mvm] invalid instruction opcode",&local_1589);
    mexcept::mexcept(pmVar4,&local_1588,INVALID_INSTR_OPCODE);
    local_158a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x78:
    local_15b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15b0,"[-][mvm] invalid instruction opcode",&local_15b1);
    mexcept::mexcept(pmVar4,&local_15b0,INVALID_INSTR_OPCODE);
    local_15b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x79:
    local_15da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15d8,"[-][mvm] invalid instruction opcode",&local_15d9);
    mexcept::mexcept(pmVar4,&local_15d8,INVALID_INSTR_OPCODE);
    local_15da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7a:
    local_1602 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1600,"[-][mvm] invalid instruction opcode",&local_1601);
    mexcept::mexcept(pmVar4,&local_1600,INVALID_INSTR_OPCODE);
    local_1602 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7b:
    local_162a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1628,"[-][mvm] invalid instruction opcode",&local_1629);
    mexcept::mexcept(pmVar4,&local_1628,INVALID_INSTR_OPCODE);
    local_162a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7c:
    local_1652 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1650,"[-][mvm] invalid instruction opcode",&local_1651);
    mexcept::mexcept(pmVar4,&local_1650,INVALID_INSTR_OPCODE);
    local_1652 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7d:
    local_167a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1678,"[-][mvm] invalid instruction opcode",&local_1679);
    mexcept::mexcept(pmVar4,&local_1678,INVALID_INSTR_OPCODE);
    local_167a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7e:
    local_16a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16a0,"[-][mvm] invalid instruction opcode",&local_16a1);
    mexcept::mexcept(pmVar4,&local_16a0,INVALID_INSTR_OPCODE);
    local_16a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x7f:
    local_16ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16c8,"[-][mvm] invalid instruction opcode",&local_16c9);
    mexcept::mexcept(pmVar4,&local_16c8,INVALID_INSTR_OPCODE);
    local_16ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x80:
    local_16f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16f0,"[-][mvm] invalid instruction opcode",&local_16f1);
    mexcept::mexcept(pmVar4,&local_16f0,INVALID_INSTR_OPCODE);
    local_16f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x81:
    local_171a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1718,"[-][mvm] invalid instruction opcode",&local_1719);
    mexcept::mexcept(pmVar4,&local_1718,INVALID_INSTR_OPCODE);
    local_171a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x82:
    local_1742 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1740,"[-][mvm] invalid instruction opcode",&local_1741);
    mexcept::mexcept(pmVar4,&local_1740,INVALID_INSTR_OPCODE);
    local_1742 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x83:
    local_176a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1768,"[-][mvm] invalid instruction opcode",&local_1769);
    mexcept::mexcept(pmVar4,&local_1768,INVALID_INSTR_OPCODE);
    local_176a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x84:
    local_1792 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1790,"[-][mvm] invalid instruction opcode",&local_1791);
    mexcept::mexcept(pmVar4,&local_1790,INVALID_INSTR_OPCODE);
    local_1792 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x85:
    local_17ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17b8,"[-][mvm] invalid instruction opcode",&local_17b9);
    mexcept::mexcept(pmVar4,&local_17b8,INVALID_INSTR_OPCODE);
    local_17ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x86:
    local_17e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17e0,"[-][mvm] invalid instruction opcode",&local_17e1);
    mexcept::mexcept(pmVar4,&local_17e0,INVALID_INSTR_OPCODE);
    local_17e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x87:
    local_180a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1808,"[-][mvm] invalid instruction opcode",&local_1809);
    mexcept::mexcept(pmVar4,&local_1808,INVALID_INSTR_OPCODE);
    local_180a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x88:
    local_1832 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1830,"[-][mvm] invalid instruction opcode",&local_1831);
    mexcept::mexcept(pmVar4,&local_1830,INVALID_INSTR_OPCODE);
    local_1832 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x89:
    local_185a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1858,"[-][mvm] invalid instruction opcode",&local_1859);
    mexcept::mexcept(pmVar4,&local_1858,INVALID_INSTR_OPCODE);
    local_185a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8a:
    local_1882 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1880,"[-][mvm] invalid instruction opcode",&local_1881);
    mexcept::mexcept(pmVar4,&local_1880,INVALID_INSTR_OPCODE);
    local_1882 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8b:
    local_18aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18a8,"[-][mvm] invalid instruction opcode",&local_18a9);
    mexcept::mexcept(pmVar4,&local_18a8,INVALID_INSTR_OPCODE);
    local_18aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8c:
    local_18d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18d0,"[-][mvm] invalid instruction opcode",&local_18d1);
    mexcept::mexcept(pmVar4,&local_18d0,INVALID_INSTR_OPCODE);
    local_18d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8d:
    local_18fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18f8,"[-][mvm] invalid instruction opcode",&local_18f9);
    mexcept::mexcept(pmVar4,&local_18f8,INVALID_INSTR_OPCODE);
    local_18fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8e:
    local_1922 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1920,"[-][mvm] invalid instruction opcode",&local_1921);
    mexcept::mexcept(pmVar4,&local_1920,INVALID_INSTR_OPCODE);
    local_1922 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x8f:
    local_194a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1948,"[-][mvm] invalid instruction opcode",&local_1949);
    mexcept::mexcept(pmVar4,&local_1948,INVALID_INSTR_OPCODE);
    local_194a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x90:
    local_1972 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1970,"[-][mvm] invalid instruction opcode",&local_1971);
    mexcept::mexcept(pmVar4,&local_1970,INVALID_INSTR_OPCODE);
    local_1972 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x91:
    local_199a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1998,"[-][mvm] invalid instruction opcode",&local_1999);
    mexcept::mexcept(pmVar4,&local_1998,INVALID_INSTR_OPCODE);
    local_199a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x92:
    local_19c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19c0,"[-][mvm] invalid instruction opcode",&local_19c1);
    mexcept::mexcept(pmVar4,&local_19c0,INVALID_INSTR_OPCODE);
    local_19c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x93:
    local_19ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19e8,"[-][mvm] invalid instruction opcode",&local_19e9);
    mexcept::mexcept(pmVar4,&local_19e8,INVALID_INSTR_OPCODE);
    local_19ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x94:
    local_1a12 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a10,"[-][mvm] invalid instruction opcode",&local_1a11);
    mexcept::mexcept(pmVar4,&local_1a10,INVALID_INSTR_OPCODE);
    local_1a12 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x95:
    local_1a3a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a38,"[-][mvm] invalid instruction opcode",&local_1a39);
    mexcept::mexcept(pmVar4,&local_1a38,INVALID_INSTR_OPCODE);
    local_1a3a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x96:
    local_1a62 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a60,"[-][mvm] invalid instruction opcode",&local_1a61);
    mexcept::mexcept(pmVar4,&local_1a60,INVALID_INSTR_OPCODE);
    local_1a62 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x97:
    local_1a8a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a88,"[-][mvm] invalid instruction opcode",&local_1a89);
    mexcept::mexcept(pmVar4,&local_1a88,INVALID_INSTR_OPCODE);
    local_1a8a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x98:
    local_1ab2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ab0,"[-][mvm] invalid instruction opcode",&local_1ab1);
    mexcept::mexcept(pmVar4,&local_1ab0,INVALID_INSTR_OPCODE);
    local_1ab2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x99:
    local_1ada = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ad8,"[-][mvm] invalid instruction opcode",&local_1ad9);
    mexcept::mexcept(pmVar4,&local_1ad8,INVALID_INSTR_OPCODE);
    local_1ada = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9a:
    local_1b02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b00,"[-][mvm] invalid instruction opcode",&local_1b01);
    mexcept::mexcept(pmVar4,&local_1b00,INVALID_INSTR_OPCODE);
    local_1b02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9b:
    local_1b2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b28,"[-][mvm] invalid instruction opcode",&local_1b29);
    mexcept::mexcept(pmVar4,&local_1b28,INVALID_INSTR_OPCODE);
    local_1b2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9c:
    local_1b52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b50,"[-][mvm] invalid instruction opcode",&local_1b51);
    mexcept::mexcept(pmVar4,&local_1b50,INVALID_INSTR_OPCODE);
    local_1b52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9d:
    local_1b7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b78,"[-][mvm] invalid instruction opcode",&local_1b79);
    mexcept::mexcept(pmVar4,&local_1b78,INVALID_INSTR_OPCODE);
    local_1b7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9e:
    local_1ba2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ba0,"[-][mvm] invalid instruction opcode",&local_1ba1);
    mexcept::mexcept(pmVar4,&local_1ba0,INVALID_INSTR_OPCODE);
    local_1ba2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0x9f:
    local_1bca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bc8,"[-][mvm] invalid instruction opcode",&local_1bc9);
    mexcept::mexcept(pmVar4,&local_1bc8,INVALID_INSTR_OPCODE);
    local_1bca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa0:
    local_1bf2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bf0,"[-][mvm] invalid instruction opcode",&local_1bf1);
    mexcept::mexcept(pmVar4,&local_1bf0,INVALID_INSTR_OPCODE);
    local_1bf2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa1:
    local_1c1a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c18,"[-][mvm] invalid instruction opcode",&local_1c19);
    mexcept::mexcept(pmVar4,&local_1c18,INVALID_INSTR_OPCODE);
    local_1c1a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa2:
    local_1c42 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c40,"[-][mvm] invalid instruction opcode",&local_1c41);
    mexcept::mexcept(pmVar4,&local_1c40,INVALID_INSTR_OPCODE);
    local_1c42 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa3:
    local_1c6a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c68,"[-][mvm] invalid instruction opcode",&local_1c69);
    mexcept::mexcept(pmVar4,&local_1c68,INVALID_INSTR_OPCODE);
    local_1c6a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa4:
    local_1c92 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c90,"[-][mvm] invalid instruction opcode",&local_1c91);
    mexcept::mexcept(pmVar4,&local_1c90,INVALID_INSTR_OPCODE);
    local_1c92 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa5:
    local_1cba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1cb8,"[-][mvm] invalid instruction opcode",&local_1cb9);
    mexcept::mexcept(pmVar4,&local_1cb8,INVALID_INSTR_OPCODE);
    local_1cba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa6:
    local_1ce2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ce0,"[-][mvm] invalid instruction opcode",&local_1ce1);
    mexcept::mexcept(pmVar4,&local_1ce0,INVALID_INSTR_OPCODE);
    local_1ce2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa7:
    local_1d0a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d08,"[-][mvm] invalid instruction opcode",&local_1d09);
    mexcept::mexcept(pmVar4,&local_1d08,INVALID_INSTR_OPCODE);
    local_1d0a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa8:
    local_1d32 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d30,"[-][mvm] invalid instruction opcode",&local_1d31);
    mexcept::mexcept(pmVar4,&local_1d30,INVALID_INSTR_OPCODE);
    local_1d32 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xa9:
    local_1d5a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d58,"[-][mvm] invalid instruction opcode",&local_1d59);
    mexcept::mexcept(pmVar4,&local_1d58,INVALID_INSTR_OPCODE);
    local_1d5a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaa:
    local_1d82 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d80,"[-][mvm] invalid instruction opcode",&local_1d81);
    mexcept::mexcept(pmVar4,&local_1d80,INVALID_INSTR_OPCODE);
    local_1d82 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xab:
    local_1daa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1da8,"[-][mvm] invalid instruction opcode",&local_1da9);
    mexcept::mexcept(pmVar4,&local_1da8,INVALID_INSTR_OPCODE);
    local_1daa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xac:
    local_1dd2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1dd0,"[-][mvm] invalid instruction opcode",&local_1dd1);
    mexcept::mexcept(pmVar4,&local_1dd0,INVALID_INSTR_OPCODE);
    local_1dd2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xad:
    local_1dfa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1df8,"[-][mvm] invalid instruction opcode",&local_1df9);
    mexcept::mexcept(pmVar4,&local_1df8,INVALID_INSTR_OPCODE);
    local_1dfa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xae:
    local_1e22 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e20,"[-][mvm] invalid instruction opcode",&local_1e21);
    mexcept::mexcept(pmVar4,&local_1e20,INVALID_INSTR_OPCODE);
    local_1e22 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xaf:
    local_1e4a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e48,"[-][mvm] invalid instruction opcode",&local_1e49);
    mexcept::mexcept(pmVar4,&local_1e48,INVALID_INSTR_OPCODE);
    local_1e4a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb0:
    local_1e72 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e70,"[-][mvm] invalid instruction opcode",&local_1e71);
    mexcept::mexcept(pmVar4,&local_1e70,INVALID_INSTR_OPCODE);
    local_1e72 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb1:
    local_1e9a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e98,"[-][mvm] invalid instruction opcode",&local_1e99);
    mexcept::mexcept(pmVar4,&local_1e98,INVALID_INSTR_OPCODE);
    local_1e9a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb2:
    local_1ec2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ec0,"[-][mvm] invalid instruction opcode",&local_1ec1);
    mexcept::mexcept(pmVar4,&local_1ec0,INVALID_INSTR_OPCODE);
    local_1ec2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb3:
    local_1eea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ee8,"[-][mvm] invalid instruction opcode",&local_1ee9);
    mexcept::mexcept(pmVar4,&local_1ee8,INVALID_INSTR_OPCODE);
    local_1eea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb4:
    local_1f12 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f10,"[-][mvm] invalid instruction opcode",&local_1f11);
    mexcept::mexcept(pmVar4,&local_1f10,INVALID_INSTR_OPCODE);
    local_1f12 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb5:
    local_1f3a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f38,"[-][mvm] invalid instruction opcode",&local_1f39);
    mexcept::mexcept(pmVar4,&local_1f38,INVALID_INSTR_OPCODE);
    local_1f3a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb6:
    local_1f62 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f60,"[-][mvm] invalid instruction opcode",&local_1f61);
    mexcept::mexcept(pmVar4,&local_1f60,INVALID_INSTR_OPCODE);
    local_1f62 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb7:
    local_1f8a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f88,"[-][mvm] invalid instruction opcode",&local_1f89);
    mexcept::mexcept(pmVar4,&local_1f88,INVALID_INSTR_OPCODE);
    local_1f8a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb8:
    local_1fb2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fb0,"[-][mvm] invalid instruction opcode",&local_1fb1);
    mexcept::mexcept(pmVar4,&local_1fb0,INVALID_INSTR_OPCODE);
    local_1fb2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xb9:
    local_1fda = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fd8,"[-][mvm] invalid instruction opcode",&local_1fd9);
    mexcept::mexcept(pmVar4,&local_1fd8,INVALID_INSTR_OPCODE);
    local_1fda = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xba:
    local_2002 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2000,"[-][mvm] invalid instruction opcode",&local_2001);
    mexcept::mexcept(pmVar4,&local_2000,INVALID_INSTR_OPCODE);
    local_2002 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbb:
    local_202a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2028,"[-][mvm] invalid instruction opcode",&local_2029);
    mexcept::mexcept(pmVar4,&local_2028,INVALID_INSTR_OPCODE);
    local_202a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbc:
    local_2052 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2050,"[-][mvm] invalid instruction opcode",&local_2051);
    mexcept::mexcept(pmVar4,&local_2050,INVALID_INSTR_OPCODE);
    local_2052 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbd:
    local_207a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2078,"[-][mvm] invalid instruction opcode",&local_2079);
    mexcept::mexcept(pmVar4,&local_2078,INVALID_INSTR_OPCODE);
    local_207a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbe:
    local_20a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20a0,"[-][mvm] invalid instruction opcode",&local_20a1);
    mexcept::mexcept(pmVar4,&local_20a0,INVALID_INSTR_OPCODE);
    local_20a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xbf:
    local_20ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20c8,"[-][mvm] invalid instruction opcode",&local_20c9);
    mexcept::mexcept(pmVar4,&local_20c8,INVALID_INSTR_OPCODE);
    local_20ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc0:
    local_20f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20f0,"[-][mvm] invalid instruction opcode",&local_20f1);
    mexcept::mexcept(pmVar4,&local_20f0,INVALID_INSTR_OPCODE);
    local_20f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc1:
    local_211a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2118,"[-][mvm] invalid instruction opcode",&local_2119);
    mexcept::mexcept(pmVar4,&local_2118,INVALID_INSTR_OPCODE);
    local_211a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc2:
    local_2142 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2140,"[-][mvm] invalid instruction opcode",&local_2141);
    mexcept::mexcept(pmVar4,&local_2140,INVALID_INSTR_OPCODE);
    local_2142 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc3:
    local_216a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2168,"[-][mvm] invalid instruction opcode",&local_2169);
    mexcept::mexcept(pmVar4,&local_2168,INVALID_INSTR_OPCODE);
    local_216a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc4:
    local_2192 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2190,"[-][mvm] invalid instruction opcode",&local_2191);
    mexcept::mexcept(pmVar4,&local_2190,INVALID_INSTR_OPCODE);
    local_2192 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc5:
    local_21ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_21b8,"[-][mvm] invalid instruction opcode",&local_21b9);
    mexcept::mexcept(pmVar4,&local_21b8,INVALID_INSTR_OPCODE);
    local_21ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc6:
    local_21e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_21e0,"[-][mvm] invalid instruction opcode",&local_21e1);
    mexcept::mexcept(pmVar4,&local_21e0,INVALID_INSTR_OPCODE);
    local_21e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 199:
    local_220a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2208,"[-][mvm] invalid instruction opcode",&local_2209);
    mexcept::mexcept(pmVar4,&local_2208,INVALID_INSTR_OPCODE);
    local_220a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 200:
    local_2232 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2230,"[-][mvm] invalid instruction opcode",&local_2231);
    mexcept::mexcept(pmVar4,&local_2230,INVALID_INSTR_OPCODE);
    local_2232 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xc9:
    local_225a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2258,"[-][mvm] invalid instruction opcode",&local_2259);
    mexcept::mexcept(pmVar4,&local_2258,INVALID_INSTR_OPCODE);
    local_225a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xca:
    local_2282 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2280,"[-][mvm] invalid instruction opcode",&local_2281);
    mexcept::mexcept(pmVar4,&local_2280,INVALID_INSTR_OPCODE);
    local_2282 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcb:
    local_22aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22a8,"[-][mvm] invalid instruction opcode",&local_22a9);
    mexcept::mexcept(pmVar4,&local_22a8,INVALID_INSTR_OPCODE);
    local_22aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcc:
    local_22d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22d0,"[-][mvm] invalid instruction opcode",&local_22d1);
    mexcept::mexcept(pmVar4,&local_22d0,INVALID_INSTR_OPCODE);
    local_22d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcd:
    local_22fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_22f8,"[-][mvm] invalid instruction opcode",&local_22f9);
    mexcept::mexcept(pmVar4,&local_22f8,INVALID_INSTR_OPCODE);
    local_22fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xce:
    local_2322 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2320,"[-][mvm] invalid instruction opcode",&local_2321);
    mexcept::mexcept(pmVar4,&local_2320,INVALID_INSTR_OPCODE);
    local_2322 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xcf:
    local_234a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2348,"[-][mvm] invalid instruction opcode",&local_2349);
    mexcept::mexcept(pmVar4,&local_2348,INVALID_INSTR_OPCODE);
    local_234a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd0:
    local_2372 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2370,"[-][mvm] invalid instruction opcode",&local_2371);
    mexcept::mexcept(pmVar4,&local_2370,INVALID_INSTR_OPCODE);
    local_2372 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd1:
    local_239a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2398,"[-][mvm] invalid instruction opcode",&local_2399);
    mexcept::mexcept(pmVar4,&local_2398,INVALID_INSTR_OPCODE);
    local_239a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd2:
    local_23c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23c0,"[-][mvm] invalid instruction opcode",&local_23c1);
    mexcept::mexcept(pmVar4,&local_23c0,INVALID_INSTR_OPCODE);
    local_23c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd3:
    local_23ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_23e8,"[-][mvm] invalid instruction opcode",&local_23e9);
    mexcept::mexcept(pmVar4,&local_23e8,INVALID_INSTR_OPCODE);
    local_23ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd4:
    local_2412 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2410,"[-][mvm] invalid instruction opcode",&local_2411);
    mexcept::mexcept(pmVar4,&local_2410,INVALID_INSTR_OPCODE);
    local_2412 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd5:
    local_243a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2438,"[-][mvm] invalid instruction opcode",&local_2439);
    mexcept::mexcept(pmVar4,&local_2438,INVALID_INSTR_OPCODE);
    local_243a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd6:
    local_2462 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2460,"[-][mvm] invalid instruction opcode",&local_2461);
    mexcept::mexcept(pmVar4,&local_2460,INVALID_INSTR_OPCODE);
    local_2462 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd7:
    local_248a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2488,"[-][mvm] invalid instruction opcode",&local_2489);
    mexcept::mexcept(pmVar4,&local_2488,INVALID_INSTR_OPCODE);
    local_248a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd8:
    local_24b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_24b0,"[-][mvm] invalid instruction opcode",&local_24b1);
    mexcept::mexcept(pmVar4,&local_24b0,INVALID_INSTR_OPCODE);
    local_24b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xd9:
    local_24da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_24d8,"[-][mvm] invalid instruction opcode",&local_24d9);
    mexcept::mexcept(pmVar4,&local_24d8,INVALID_INSTR_OPCODE);
    local_24da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xda:
    local_2502 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2500,"[-][mvm] invalid instruction opcode",&local_2501);
    mexcept::mexcept(pmVar4,&local_2500,INVALID_INSTR_OPCODE);
    local_2502 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdb:
    local_252a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2528,"[-][mvm] invalid instruction opcode",&local_2529);
    mexcept::mexcept(pmVar4,&local_2528,INVALID_INSTR_OPCODE);
    local_252a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdc:
    local_2552 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2550,"[-][mvm] invalid instruction opcode",&local_2551);
    mexcept::mexcept(pmVar4,&local_2550,INVALID_INSTR_OPCODE);
    local_2552 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdd:
    local_257a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2578,"[-][mvm] invalid instruction opcode",&local_2579);
    mexcept::mexcept(pmVar4,&local_2578,INVALID_INSTR_OPCODE);
    local_257a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xde:
    local_25a2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25a0,"[-][mvm] invalid instruction opcode",&local_25a1);
    mexcept::mexcept(pmVar4,&local_25a0,INVALID_INSTR_OPCODE);
    local_25a2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xdf:
    local_25ca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25c8,"[-][mvm] invalid instruction opcode",&local_25c9);
    mexcept::mexcept(pmVar4,&local_25c8,INVALID_INSTR_OPCODE);
    local_25ca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe0:
    local_25f2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_25f0,"[-][mvm] invalid instruction opcode",&local_25f1);
    mexcept::mexcept(pmVar4,&local_25f0,INVALID_INSTR_OPCODE);
    local_25f2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe1:
    local_261a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2618,"[-][mvm] invalid instruction opcode",&local_2619);
    mexcept::mexcept(pmVar4,&local_2618,INVALID_INSTR_OPCODE);
    local_261a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe2:
    local_2642 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2640,"[-][mvm] invalid instruction opcode",&local_2641);
    mexcept::mexcept(pmVar4,&local_2640,INVALID_INSTR_OPCODE);
    local_2642 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe3:
    local_266a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2668,"[-][mvm] invalid instruction opcode",&local_2669);
    mexcept::mexcept(pmVar4,&local_2668,INVALID_INSTR_OPCODE);
    local_266a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe4:
    local_2692 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2690,"[-][mvm] invalid instruction opcode",&local_2691);
    mexcept::mexcept(pmVar4,&local_2690,INVALID_INSTR_OPCODE);
    local_2692 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe5:
    local_26ba = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_26b8,"[-][mvm] invalid instruction opcode",&local_26b9);
    mexcept::mexcept(pmVar4,&local_26b8,INVALID_INSTR_OPCODE);
    local_26ba = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe6:
    local_26e2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_26e0,"[-][mvm] invalid instruction opcode",&local_26e1);
    mexcept::mexcept(pmVar4,&local_26e0,INVALID_INSTR_OPCODE);
    local_26e2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe7:
    local_270a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2708,"[-][mvm] invalid instruction opcode",&local_2709);
    mexcept::mexcept(pmVar4,&local_2708,INVALID_INSTR_OPCODE);
    local_270a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe8:
    local_2732 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2730,"[-][mvm] invalid instruction opcode",&local_2731);
    mexcept::mexcept(pmVar4,&local_2730,INVALID_INSTR_OPCODE);
    local_2732 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xe9:
    local_275a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2758,"[-][mvm] invalid instruction opcode",&local_2759);
    mexcept::mexcept(pmVar4,&local_2758,INVALID_INSTR_OPCODE);
    local_275a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xea:
    local_2782 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2780,"[-][mvm] invalid instruction opcode",&local_2781);
    mexcept::mexcept(pmVar4,&local_2780,INVALID_INSTR_OPCODE);
    local_2782 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xeb:
    local_27aa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27a8,"[-][mvm] invalid instruction opcode",&local_27a9);
    mexcept::mexcept(pmVar4,&local_27a8,INVALID_INSTR_OPCODE);
    local_27aa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xec:
    local_27d2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27d0,"[-][mvm] invalid instruction opcode",&local_27d1);
    mexcept::mexcept(pmVar4,&local_27d0,INVALID_INSTR_OPCODE);
    local_27d2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xed:
    local_27fa = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_27f8,"[-][mvm] invalid instruction opcode",&local_27f9);
    mexcept::mexcept(pmVar4,&local_27f8,INVALID_INSTR_OPCODE);
    local_27fa = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xee:
    local_2822 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2820,"[-][mvm] invalid instruction opcode",&local_2821);
    mexcept::mexcept(pmVar4,&local_2820,INVALID_INSTR_OPCODE);
    local_2822 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xef:
    local_284a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2848,"[-][mvm] invalid instruction opcode",&local_2849);
    mexcept::mexcept(pmVar4,&local_2848,INVALID_INSTR_OPCODE);
    local_284a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf0:
    local_2872 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2870,"[-][mvm] invalid instruction opcode",&local_2871);
    mexcept::mexcept(pmVar4,&local_2870,INVALID_INSTR_OPCODE);
    local_2872 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf1:
    local_289a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2898,"[-][mvm] invalid instruction opcode",&local_2899);
    mexcept::mexcept(pmVar4,&local_2898,INVALID_INSTR_OPCODE);
    local_289a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf2:
    local_28c2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28c0,"[-][mvm] invalid instruction opcode",&local_28c1);
    mexcept::mexcept(pmVar4,&local_28c0,INVALID_INSTR_OPCODE);
    local_28c2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf3:
    local_28ea = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28e8,"[-][mvm] invalid instruction opcode",&local_28e9);
    mexcept::mexcept(pmVar4,&local_28e8,INVALID_INSTR_OPCODE);
    local_28ea = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf4:
    local_2912 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2910,"[-][mvm] invalid instruction opcode",&local_2911);
    mexcept::mexcept(pmVar4,&local_2910,INVALID_INSTR_OPCODE);
    local_2912 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf5:
    local_293a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2938,"[-][mvm] invalid instruction opcode",&local_2939);
    mexcept::mexcept(pmVar4,&local_2938,INVALID_INSTR_OPCODE);
    local_293a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf6:
    local_2962 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2960,"[-][mvm] invalid instruction opcode",&local_2961);
    mexcept::mexcept(pmVar4,&local_2960,INVALID_INSTR_OPCODE);
    local_2962 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf7:
    local_298a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2988,"[-][mvm] invalid instruction opcode",&local_2989);
    mexcept::mexcept(pmVar4,&local_2988,INVALID_INSTR_OPCODE);
    local_298a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf8:
    local_29b2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_29b0,"[-][mvm] invalid instruction opcode",&local_29b1);
    mexcept::mexcept(pmVar4,&local_29b0,INVALID_INSTR_OPCODE);
    local_29b2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xf9:
    local_29da = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_29d8,"[-][mvm] invalid instruction opcode",&local_29d9);
    mexcept::mexcept(pmVar4,&local_29d8,INVALID_INSTR_OPCODE);
    local_29da = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfa:
    local_2a02 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a00,"[-][mvm] invalid instruction opcode",&local_2a01);
    mexcept::mexcept(pmVar4,&local_2a00,INVALID_INSTR_OPCODE);
    local_2a02 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfb:
    local_2a2a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a28,"[-][mvm] invalid instruction opcode",&local_2a29);
    mexcept::mexcept(pmVar4,&local_2a28,INVALID_INSTR_OPCODE);
    local_2a2a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfc:
    local_2a52 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a50,"[-][mvm] invalid instruction opcode",&local_2a51);
    mexcept::mexcept(pmVar4,&local_2a50,INVALID_INSTR_OPCODE);
    local_2a52 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfd:
    local_2a7a = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a78,"[-][mvm] invalid instruction opcode",&local_2a79);
    mexcept::mexcept(pmVar4,&local_2a78,INVALID_INSTR_OPCODE);
    local_2a7a = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xfe:
    local_2aa2 = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2aa0,"[-][mvm] invalid instruction opcode",&local_2aa1);
    mexcept::mexcept(pmVar4,&local_2aa0,INVALID_INSTR_OPCODE);
    local_2aa2 = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  case 0xff:
    local_2aca = 1;
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2ac8,"[-][mvm] invalid instruction opcode",&local_2ac9);
    mexcept::mexcept(pmVar4,&local_2ac8,INVALID_INSTR_OPCODE);
    local_2aca = 0;
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  default:
    pmVar4 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2af0,"[-][mvm] instruction opcode overflow",&local_2af1);
    mexcept::mexcept(pmVar4,&local_2af0,INSTR_OPCODE_OVERFLOW);
    __cxa_throw(pmVar4,&mexcept::typeinfo,mexcept::~mexcept);
  }
  instr_index._5_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::__cxx11::istringstream::~istringstream
            ((istringstream *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}